

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<int>::appendInitialize(QArrayDataPointer<int> *this,qsizetype newSize)

{
  int *piVar1;
  long in_RSI;
  int *in_RDI;
  int *e;
  int *b;
  
  begin((QArrayDataPointer<int> *)0x5dc260);
  piVar1 = begin((QArrayDataPointer<int> *)0x5dc279);
  std::uninitialized_value_construct<int*>(piVar1 + in_RSI,in_RDI);
  *(long *)(in_RDI + 4) = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }